

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

void __thiscall wabt::WastParser::TokenQueue::push_back(TokenQueue *this,Token t)

{
  bool bVar1;
  ulong uVar2;
  optional<wabt::Token> *poVar3;
  
  bVar1 = this->i;
  uVar2 = (ulong)bVar1 ^ 1;
  if ((this->tokens)._M_elems[uVar2].super__Optional_base<wabt::Token,_true,_true>._M_payload.
      super__Optional_payload_base<wabt::Token>._M_engaged != true) {
    poVar3 = (this->tokens)._M_elems + uVar2;
    *(char **)((long)&(poVar3->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload + 0x30) =
         t.field_2.text_._M_str;
    *(char **)((long)&(poVar3->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload + 0x38) =
         t.field_2.literal_.text._M_str;
    *(undefined8 *)
     ((long)&(poVar3->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x20) = t._32_8_;
    *(size_t *)
     ((long)&(poVar3->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x28) = t.field_2.text_._M_len;
    (((anon_union_16_2_ecfd7102_for_Location_1 *)
     ((long)&(poVar3->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc + 0x10))->field_1).
    offset = (size_t)t.loc.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(poVar3->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc + 0x18) =
         t.loc.field_1._8_8_;
    *(size_t *)
     &(poVar3->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
      super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc = t.loc.filename._M_len;
    *(char **)((long)&(poVar3->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc + 8) =
         t.loc.filename._M_str;
    (poVar3->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
    super__Optional_payload_base<wabt::Token>._M_engaged = true;
    if ((this->tokens)._M_elems[bVar1].super__Optional_base<wabt::Token,_true,_true>._M_payload.
        super__Optional_payload_base<wabt::Token>._M_engaged == false) {
      this->i = SUB81(uVar2,0);
    }
    return;
  }
  __assert_fail("!tokens[!i]",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                ,0xf1b,"void wabt::WastParser::TokenQueue::push_back(Token)");
}

Assistant:

void WastParser::TokenQueue::push_back(Token t) {
  assert(!tokens[!i]);
  tokens[!i] = t;
  if (empty()) {
    i = !i;
  }
}